

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuconnection.cpp
# Opt level: O0

bool __thiscall
QDBusMenuConnection::registerTrayIconWithWatcher(QDBusMenuConnection *this,QDBusTrayIcon *item)

{
  QLatin1StringView latin1;
  byte bVar1;
  char *in_RDI;
  long in_FS_OFFSET;
  QDBusMessage registerMethod;
  rvalue_ref in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  QList<QVariant> *this_00;
  char *in_stack_ffffffffffffff28;
  QVariant *this_01;
  QString *in_stack_ffffffffffffff30;
  QString *pQVar2;
  undefined8 in_stack_ffffffffffffff50;
  QDBusMessage *this_02;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 local_80 [24];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  QList<QVariant> local_48;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____L1(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  this_00 = &local_48;
  latin1.m_data._0_7_ = in_stack_ffffffffffffff58;
  latin1.m_size = in_stack_ffffffffffffff50;
  latin1.m_data._7_1_ = in_stack_ffffffffffffff5f;
  QString::QString(in_stack_ffffffffffffff30,latin1);
  this_02 = (QDBusMessage *)&local_30;
  QDBusMessage::createMethodCall
            ((QString *)this_02,(QString *)&StatusNotifierWatcherService,
             (QString *)&StatusNotifierWatcherPath,(QString *)&StatusNotifierWatcherService);
  QString::~QString((QString *)0xaf2c6b);
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  QList<QVariant>::QList((QList<QVariant> *)0xaf2c94);
  pQVar2 = (QString *)local_80;
  QDBusConnection::baseService();
  this_01 = &local_28;
  ::QVariant::QVariant(this_01,pQVar2);
  QList<QVariant>::operator<<(this_00,in_stack_ffffffffffffff18);
  QDBusMessage::setArguments((QList_conflict3 *)this_02);
  ::QVariant::~QVariant(this_01);
  QString::~QString((QString *)0xaf2cf8);
  QList<QVariant>::~QList((QList<QVariant> *)0xaf2d02);
  bVar1 = QDBusConnection::callWithCallback
                    ((QDBusMessage *)(in_RDI + 0x28),(QObject *)this_02,in_RDI,
                     "2trayIconRegistered()",0xbf822e);
  QDBusMessage::~QDBusMessage(this_02);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QDBusMenuConnection::registerTrayIconWithWatcher(QDBusTrayIcon *item)
{
    Q_UNUSED(item);
    QDBusMessage registerMethod = QDBusMessage::createMethodCall(
                StatusNotifierWatcherService, StatusNotifierWatcherPath, StatusNotifierWatcherService,
                "RegisterStatusNotifierItem"_L1);
    registerMethod.setArguments(QVariantList() << m_connection.baseService());
    return m_connection.callWithCallback(registerMethod, this, SIGNAL(trayIconRegistered()), SLOT(dbusError(QDBusError)));
}